

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O0

size_t rcnb_encode_blockend(wchar_t *code_out,rcnb_encodestate *state_in)

{
  byte *in_RSI;
  wchar_t *in_RDI;
  wchar_t *code_char;
  wchar_t *local_18;
  byte *local_10;
  wchar_t *local_8;
  
  local_18 = in_RDI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((*in_RSI & 1) != 0) {
    rcnb_encode_byte(in_RSI[1],&local_18);
  }
  *local_18 = L'\0';
  *local_10 = 0;
  return (long)local_18 - (long)local_8 >> 2;
}

Assistant:

size_t rcnb_encode_blockend(wchar_t* const code_out, rcnb_encodestate* state_in)
{
    wchar_t* code_char = code_out;
    if (state_in->cached) {
        rcnb_encode_byte(*(unsigned char*)(&state_in->trailing_byte), &code_char);
    }
    *code_char = 0;
    state_in->cached = false;
    return code_char - code_out;
}